

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

ValueType __thiscall wabt::interp::FuncDesc::GetLocalType(FuncDesc *this,Index index)

{
  pointer pTVar1;
  pointer pLVar2;
  ulong uVar3;
  ulong uVar4;
  pointer pLVar5;
  difference_type __d;
  ulong uVar6;
  
  pTVar1 = (this->type).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->type).params.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 2;
  if (index < uVar3) {
    pLVar5 = (pointer)(pTVar1 + index);
  }
  else {
    pLVar5 = (this->locals).
             super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pLVar2 = (this->locals).
             super__Vector_base<wabt::interp::LocalDesc,_std::allocator<wabt::interp::LocalDesc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar6 = ((long)pLVar2 - (long)pLVar5) / 0xc;
    while (uVar4 = uVar6, 0 < (long)uVar4) {
      uVar6 = uVar4 >> 1;
      if (pLVar5[uVar6].end < (index - (int)uVar3) + 1) {
        pLVar5 = pLVar5 + uVar6 + 1;
        uVar6 = ~uVar6 + uVar4;
      }
    }
    if (pLVar5 == pLVar2) {
      __assert_fail("iter != locals.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp.cc"
                    ,0xbf,"ValueType wabt::interp::FuncDesc::GetLocalType(Index) const");
    }
  }
  return (ValueType)(pLVar5->type).enum_;
}

Assistant:

ValueType FuncDesc::GetLocalType(Index index) const {
  if (index < type.params.size()) {
    return type.params[index];
  }
  index -= type.params.size();

  auto iter = std::lower_bound(
      locals.begin(), locals.end(), index + 1,
      [](const LocalDesc& lhs, Index rhs) { return lhs.end < rhs; });
  assert(iter != locals.end());
  return iter->type;
}